

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::ScopeToString_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,SetScope scope)

{
  InternalException *this_00;
  undefined7 in_register_00000011;
  char *pcVar1;
  allocator local_59;
  string local_58;
  string local_38;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = anon_var_dwarf_4b0ffdd + 9;
    break;
  case 1:
    pcVar1 = "LOCAL";
    break;
  case 2:
    pcVar1 = "SESSION";
    break;
  case 3:
    pcVar1 = "GLOBAL";
    break;
  case 4:
    pcVar1 = "VARIABLE";
    break;
  default:
    this_00 = (InternalException *)
              __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,scope));
    ::std::__cxx11::string::string
              ((string *)&local_58,"ToString not implemented for SetScope of type: %s",&local_59);
    EnumUtil::ToString<duckdb::SetScope>(&local_38,(SetScope)((ulong)this & 0xffffffff));
    InternalException::InternalException<std::__cxx11::string>(this_00,&local_58,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static string ScopeToString(SetScope scope) {
	switch (scope) {
	case SetScope::AUTOMATIC:
		return "";
	case SetScope::LOCAL:
		return "LOCAL";
	case SetScope::SESSION:
		return "SESSION";
	case SetScope::GLOBAL:
		return "GLOBAL";
	case SetScope::VARIABLE:
		return "VARIABLE";
	default:
		throw InternalException("ToString not implemented for SetScope of type: %s", EnumUtil::ToString(scope));
	}
}